

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
* __thiscall
testing::internal::
FunctionMocker<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
::AddNewExpectation(FunctionMocker<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
                    *this,char *file,int line,string *source_text,ArgumentMatcherTuple *m)

{
  Sequence *this_00;
  void *mock_obj;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *this_01;
  Sequence **ppSVar1;
  Expectation local_70;
  Sequence *local_60;
  Sequence *implicit_sequence;
  shared_ptr<testing::internal::ExpectationBase> untyped_expectation;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *expectation;
  ArgumentMatcherTuple *m_local;
  string *source_text_local;
  int line_local;
  char *file_local;
  FunctionMocker<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *this_local;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  this_01 = (TypedExpectation<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
             *)operator_new(0x158);
  TypedExpectation<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  ::TypedExpectation(this_01,this,file,line,source_text,m);
  std::shared_ptr<testing::internal::ExpectationBase>::
  shared_ptr<testing::internal::TypedExpectation<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>,void>
            ((shared_ptr<testing::internal::ExpectationBase> *)&implicit_sequence,this_01);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::push_back(&(this->super_UntypedFunctionMockerBase).untyped_expectations_,
              (shared_ptr<testing::internal::ExpectationBase> *)&implicit_sequence);
  ppSVar1 = ThreadLocal<testing::Sequence_*>::get
                      ((ThreadLocal<testing::Sequence_*> *)g_gmock_implicit_sequence);
  this_00 = *ppSVar1;
  local_60 = this_00;
  if (this_00 != (Sequence *)0x0) {
    Expectation::Expectation
              (&local_70,(shared_ptr<testing::internal::ExpectationBase> *)&implicit_sequence);
    Sequence::AddExpectation(this_00,&local_70);
    Expectation::~Expectation(&local_70);
  }
  std::shared_ptr<testing::internal::ExpectationBase>::~shared_ptr
            ((shared_ptr<testing::internal::ExpectationBase> *)&implicit_sequence);
  return this_01;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    TypedExpectation<F>* const expectation =
        new TypedExpectation<F>(this, file, line, source_text, m);
    const std::shared_ptr<ExpectationBase> untyped_expectation(expectation);
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    untyped_expectations_.push_back(untyped_expectation);

    // Adds this expectation into the implicit sequence if there is one.
    Sequence* const implicit_sequence = g_gmock_implicit_sequence.get();
    if (implicit_sequence != nullptr) {
      implicit_sequence->AddExpectation(Expectation(untyped_expectation));
    }

    return *expectation;
  }